

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O1

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,String *data)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_string).field_2;
  pcVar1 = (this->_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->_string)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String String::operator+ (const String& data) const
{
	String newString = *this;
	newString.append (data);
	return newString;
}